

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O1

Matrix3d *
Util::ECEF2ECI(Matrix3d *__return_storage_ptr__,double JD_UTC,MatrixXd *nut80ptr,
              MatrixXd *iau1980ptr,
              vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *matvecptr)

{
  double *pdVar1;
  ActualDstType actualDst;
  long lVar2;
  ActualDstType actualDst_1;
  Matrix<double,_3,_3,_0,_3,_3> *pMVar3;
  Matrix3d *pMVar4;
  iterator __position;
  Matrix3d *pMVar5;
  long lVar6;
  byte bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar19;
  double dVar20;
  undefined1 auVar18 [16];
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> order;
  Matrix3d horror;
  Matrix3d P;
  Matrix3d S;
  Matrix3d W;
  Matrix3d N;
  vector<int,_std::allocator<int>_> local_5a0;
  double local_588;
  double local_578;
  undefined8 uStack_570;
  double local_568;
  double local_558;
  double dStack_550;
  double local_540;
  double local_538;
  vector<Eigen::Matrix<double,3,3,0,3,3>,std::allocator<Eigen::Matrix<double,3,3,0,3,3>>> *local_530
  ;
  double local_528;
  double local_520;
  vector<int,_std::allocator<int>_> local_518;
  vector<int,_std::allocator<int>_> local_500;
  vector<int,_std::allocator<int>_> local_4e8;
  vector<int,_std::allocator<int>_> local_4d0;
  Matrix3d local_4b8;
  Matrix3d *local_470;
  Matrix3d *local_468;
  Matrix3d *local_460;
  undefined8 local_458;
  Vector3d local_450;
  double local_438 [4];
  double dStack_418;
  double local_410;
  double local_408;
  double dStack_400;
  double local_3f8;
  Matrix3d *local_3f0;
  double *local_3e8;
  Matrix3d *local_3e0;
  undefined8 local_3d8;
  double local_3c8;
  undefined8 uStack_3c0;
  double local_3b8;
  undefined8 uStack_3b0;
  double local_3a8;
  undefined8 uStack_3a0;
  double local_398;
  undefined8 uStack_390;
  double local_388;
  double dStack_380;
  undefined1 local_378 [16];
  double local_368;
  undefined1 local_358 [16];
  double local_348;
  Vector3d local_340;
  Matrix<double,_3,_3,_0,_3,_3> local_328;
  Matrix3d local_2d8;
  double dStack_290;
  Matrix3d local_288;
  double dStack_240;
  Matrix3d local_238;
  double dStack_1f0;
  Matrix3d local_1e8;
  Matrix3d local_198;
  Matrix3d local_150;
  Matrix3d local_108;
  Matrix3d local_c0;
  Matrix3d local_78;
  
  bVar7 = 0;
  dVar8 = JD_UTC + -2400000.5;
  dVar21 = (dVar8 + 0.00042824074074074075 + 0.00037249999999999995 + -51544.5) / 36525.0;
  local_530 = (vector<Eigen::Matrix<double,3,3,0,3,3>,std::allocator<Eigen::Matrix<double,3,3,0,3,3>>>
               *)matvecptr;
  dVar9 = floor(dVar8);
  pdVar1 = (iau1980ptr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  lVar6 = (iau1980ptr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows;
  dVar10 = floor(dVar8 - *pdVar1);
  lVar2 = (long)(int)dVar10;
  local_398 = pdVar1[lVar6 + lVar2];
  uStack_390 = 0;
  local_3a8 = pdVar1[lVar6 + lVar2 + 1];
  uStack_3a0 = 0;
  local_3b8 = pdVar1[lVar6 * 2 + lVar2];
  uStack_3b0 = 0;
  local_3c8 = pdVar1[lVar6 * 2 + lVar2 + 1];
  uStack_3c0 = 0;
  local_528 = pdVar1[lVar6 * 3 + lVar2];
  local_520 = pdVar1[lVar6 * 3 + lVar2 + 1];
  local_538 = pdVar1[lVar6 * 4 + lVar2];
  local_540 = pdVar1[lVar6 * 4 + lVar2 + 1];
  dVar22 = dVar21 * dVar21;
  dVar10 = pow(dVar21,3.0);
  local_588 = pow(dVar21,3.0);
  local_558 = pow(dVar21,3.0);
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       4.24399158341274e-314;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1].
  _0_4_ = 3;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_4b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_5a0,__l,(allocator_type *)local_438);
  auVar23._0_8_ = (local_558 * 0.018203 + dVar21 * 2306.2181 + dVar22 * 1.09468) * 3.141592653589793
  ;
  auVar23._8_8_ =
       (local_588 * -0.041833 + dVar21 * 2004.3109 + dVar22 * -0.42665) * 3.141592653589793;
  local_358 = divpd(auVar23,_DAT_00132be0);
  local_388 = dVar21;
  dStack_380 = dVar21;
  local_348 = ((dVar10 * 0.017998 + dVar21 * 2306.2181 + dVar22 * 0.30188) * 3.141592653589793) /
              648000.0;
  std::vector<int,_std::allocator<int>_>::vector(&local_4d0,&local_5a0);
  Angle2RotM(&local_2d8,(Vector3d *)local_358,&local_4d0);
  if (local_4d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_578 = dVar8 - dVar9;
  uStack_570 = 0;
  dVar9 = pow(dVar21,3.0);
  local_568 = (dVar9 * 0.001813 + dVar22 * -0.00059 + dVar21 * -46.815 + 84381.448) *
              3.141592653589793;
  dVar9 = pow(dVar21,3.0);
  dVar10 = pow(dVar21,3.0);
  dVar11 = pow(dVar21,3.0);
  dVar12 = pow(dVar21,3.0);
  dVar13 = pow(dVar21,3.0);
  dVar13 = ((dVar13 * 2.2e-06 + dVar22 * 0.0020708 + dVar21 * -1934.1362608 + 125.04452222) *
           3.141592653589793) / 180.0;
  dVar17 = 0.0;
  dVar20 = 0.0;
  lVar6 = 0;
  do {
    pdVar1 = (nut80ptr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar2 = (nut80ptr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    dVar15 = *(double *)((long)pdVar1 + lVar2 * 0x30 + lVar6);
    dVar16 = *(double *)((long)pdVar1 + lVar2 * 0x40 + lVar6);
    local_588 = *(double *)((long)pdVar1 + lVar2 * 0x20 + lVar6) * dVar13 +
                *(double *)((long)pdVar1 + lVar2 * 0x18 + lVar6) *
                (((dVar12 * 5.299999999999999e-06 +
                  dVar22 * -0.0019142 + dVar21 * 445267.11148 + 297.85036306) * 3.141592653589793) /
                180.0) + *(double *)((long)pdVar1 + lVar2 * 0x10 + lVar6) *
                         (((dVar11 * 3.1e-06 +
                           dVar22 * -0.0036825 + dVar21 * 483202.0175381 + 93.27191028) *
                          3.141592653589793) / 180.0) +
                         *(double *)((long)pdVar1 + lVar6) *
                         (((dVar9 * 1.7800000000000002e-05 +
                           dVar22 * 0.0086972 + dVar21 * 477198.8673981 + 134.96298139) *
                          3.141592653589793) / 180.0) +
                         *(double *)((long)pdVar1 + lVar2 * 8 + lVar6) *
                         (((dVar10 * -3.2999999999999997e-06 +
                           dVar22 * -0.0001603 + dVar21 * 35999.05034 + 357.52772333) *
                          3.141592653589793) / 180.0);
    local_558 = *(double *)((long)pdVar1 + lVar2 * 0x28 + lVar6);
    dStack_550 = *(double *)((long)pdVar1 + lVar2 * 0x38 + lVar6);
    dVar14 = sin(local_588);
    dVar15 = dVar15 * local_388 + local_558;
    dVar19 = dVar16 * dStack_380 + dStack_550;
    dVar16 = cos(local_588);
    dVar17 = dVar17 + dVar14 * dVar15;
    dVar20 = dVar20 + dVar16 * dVar19;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x350);
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       6.36598737338988e-314;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1].
  _0_4_ = 1;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&local_5a0,&local_4b8);
  local_568 = local_568 / 648000.0;
  dVar9 = (dVar17 * 0.0001 * 3.141592653589793) / 648000.0;
  local_450.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (dVar20 * 0.0001 * 3.141592653589793) / 648000.0 + local_568;
  local_450.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       -local_568;
  local_450.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       dVar9;
  std::vector<int,_std::allocator<int>_>::vector(&local_4e8,&local_5a0);
  Angle2RotM(&local_1e8,&local_450,&local_4e8);
  if (local_4e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       2.1219957919534e-314;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1].
  _0_4_ = 3;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&local_5a0,&local_4b8);
  auVar18._0_8_ = (local_578 * (local_3a8 - local_398) + local_398) * 3.141592653589793;
  auVar18._8_8_ = (local_578 * (local_3c8 - local_3b8) + local_3b8) * 3.141592653589793;
  local_378 = divpd(auVar18,_DAT_00132bf0);
  local_368 = 0.0;
  std::vector<int,_std::allocator<int>_>::vector(&local_500,&local_5a0);
  Angle2RotM(&local_238,(Vector3d *)local_378,&local_500);
  if (local_500.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_500.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_500.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_500.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  dVar10 = cos(local_568);
  dVar21 = sin(dVar13);
  local_588 = sin(dVar13 + dVar13);
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       2.12199579244747e-314;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1].
  _0_4_ = 3;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&local_5a0,&local_4b8);
  dVar8 = dVar8 + ((local_520 - local_528) * local_578 + local_528) / 86400.0 + -51544.5;
  local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       -(dVar9 * dVar10 + ((dVar21 * 0.00264 + local_588 * 6.3e-05) * 3.141592653589793) / 648000.0
        + ((dVar8 * -9.253097568194336e-24 + 5.0752099941135916e-15) * dVar8 + 6.300388098984894) *
          dVar8 + 4.894961212823059);
  local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_340.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  std::vector<int,_std::allocator<int>_>::vector(&local_518,&local_5a0);
  Angle2RotM(&local_288,&local_340,&local_518);
  if (local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pMVar4 = &local_2d8;
  pMVar5 = &local_78;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
         = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
    pMVar4 = (Matrix3d *)((long)pMVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pMVar5 = (Matrix3d *)((long)pMVar5 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  OrthoNormMat(&local_4b8,&local_78);
  pMVar4 = &local_4b8;
  pMVar5 = &local_2d8;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
         = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
    pMVar4 = (Matrix3d *)((long)pMVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pMVar5 = (Matrix3d *)((long)pMVar5 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  pMVar4 = &local_1e8;
  pMVar5 = &local_c0;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
         = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
    pMVar4 = (Matrix3d *)((long)pMVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pMVar5 = (Matrix3d *)((long)pMVar5 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  OrthoNormMat(&local_4b8,&local_c0);
  pMVar4 = &local_4b8;
  pMVar5 = &local_1e8;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
         = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
    pMVar4 = (Matrix3d *)((long)pMVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pMVar5 = (Matrix3d *)((long)pMVar5 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  pMVar4 = &local_288;
  pMVar5 = &local_108;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
         = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
    pMVar4 = (Matrix3d *)((long)pMVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pMVar5 = (Matrix3d *)((long)pMVar5 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  OrthoNormMat(&local_4b8,&local_108);
  pMVar4 = &local_4b8;
  pMVar5 = &local_288;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
         = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
    pMVar4 = (Matrix3d *)((long)pMVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pMVar5 = (Matrix3d *)((long)pMVar5 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  pMVar4 = &local_238;
  pMVar5 = &local_150;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
         = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
    pMVar4 = (Matrix3d *)((long)pMVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pMVar5 = (Matrix3d *)((long)pMVar5 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  OrthoNormMat(&local_4b8,&local_150);
  pMVar4 = &local_4b8;
  pMVar5 = &local_238;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
         = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
    pMVar4 = (Matrix3d *)((long)pMVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pMVar5 = (Matrix3d *)((long)pMVar5 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  pdVar1 = *(double **)local_530;
  *pdVar1 = local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  pdVar1[1] = local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1];
  pdVar1[2] = local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2];
  pdVar1[3] = local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3];
  pdVar1[4] = local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4];
  pdVar1[5] = local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5];
  pdVar1[6] = local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6];
  pdVar1[7] = local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7];
  pdVar1[8] = local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8];
  lVar6 = *(long *)local_530;
  *(double *)(lVar6 + 0x48) =
       local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  *(double *)(lVar6 + 0x50) =
       local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  *(double *)(lVar6 + 0x58) =
       local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  *(double *)(lVar6 + 0x60) =
       local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  *(double *)(lVar6 + 0x68) =
       local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  *(double *)(lVar6 + 0x70) =
       local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  *(double *)(lVar6 + 0x78) =
       local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  *(double *)(lVar6 + 0x80) =
       local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  *(double *)(lVar6 + 0x88) =
       local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  lVar6 = *(long *)local_530;
  *(double *)(lVar6 + 0x90) =
       local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  *(double *)(lVar6 + 0x98) =
       local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  *(double *)(lVar6 + 0xa0) =
       local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  *(double *)(lVar6 + 0xa8) =
       local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  *(double *)(lVar6 + 0xb0) =
       local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  *(double *)(lVar6 + 0xb8) =
       local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  *(double *)(lVar6 + 0xc0) =
       local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  *(double *)(lVar6 + 200) =
       local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  *(double *)(lVar6 + 0xd0) =
       local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  lVar6 = *(long *)local_530;
  *(double *)(lVar6 + 0xd8) =
       local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  *(double *)(lVar6 + 0xe0) =
       local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  *(double *)(lVar6 + 0xe8) =
       local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  *(double *)(lVar6 + 0xf0) =
       local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  *(double *)(lVar6 + 0xf8) =
       local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  *(double *)(lVar6 + 0x100) =
       local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  *(double *)(lVar6 + 0x108) =
       local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  *(double *)(lVar6 + 0x110) =
       local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  *(double *)(lVar6 + 0x118) =
       local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  local_328.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_328.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_328.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_328.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_328.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_328.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_328.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_328.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_328.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       local_578 * (local_540 - local_538) + local_538;
  __position._M_current = *(Matrix<double,_3,_3,_0,_3,_3> **)(local_530 + 8);
  if (__position._M_current == *(Matrix<double,_3,_3,_0,_3,_3> **)(local_530 + 0x10)) {
    std::vector<Eigen::Matrix<double,3,3,0,3,3>,std::allocator<Eigen::Matrix<double,3,3,0,3,3>>>::
    _M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>(local_530,__position,&local_328);
  }
  else {
    pMVar3 = &local_328;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[0] =
           (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
      pMVar3 = (Matrix<double,_3,_3,_0,_3,_3> *)((long)pMVar3 + ((ulong)bVar7 * -2 + 1) * 8);
      __position._M_current =
           (Matrix<double,_3,_3,_0,_3,_3> *)
           ((long)__position._M_current + ((ulong)bVar7 * -2 + 1) * 8);
    }
    *(long *)(local_530 + 8) = *(long *)(local_530 + 8) + 0x48;
  }
  lVar6 = 0x10;
  do {
    dVar8 = *(double *)
             ((long)local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array + lVar6);
    dVar9 = *(double *)
             ((long)local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array + lVar6 + 0x40);
    dVar10 = *(double *)((long)&dStack_1f0 + lVar6);
    *(double *)
     ((long)&local_4d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish + lVar6) =
         dVar10 * local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[3] +
         dVar9 * local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0] +
         dVar8 * local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6];
    *(double *)
     ((long)&local_4d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage + lVar6) =
         dVar10 * local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[4] +
         dVar9 * local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1] +
         dVar8 * local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7];
    *(double *)
     ((long)local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar6) =
         dVar10 * local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[5] +
         dVar8 * local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] +
         dVar9 * local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2];
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x58);
  local_470 = &local_288;
  local_468 = &local_4b8;
  local_460 = &local_288;
  local_458 = 3;
  lVar6 = 0x10;
  do {
    dVar8 = *(double *)
             ((long)local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array + lVar6);
    dVar9 = *(double *)
             ((long)local_2d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array + lVar6 + 0x40);
    dVar10 = *(double *)((long)&dStack_290 + lVar6);
    *(double *)
     ((long)local_450.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array + lVar6 + 8) =
         dVar10 * local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[3] +
         dVar9 * local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0] +
         dVar8 * local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6];
    *(double *)
     ((long)local_450.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array + lVar6 + 0x10) =
         dVar10 * local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[4] +
         dVar9 * (double)CONCAT44(local_4b8.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[1]._4_4_,
                                  local_4b8.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[1]._0_4_) +
         dVar8 * local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7];
    *(double *)((long)local_438 + lVar6) =
         local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] * dVar10 +
         dVar8 * local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] +
         local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2] * dVar9;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x58);
  local_3f0 = &local_238;
  local_3e8 = local_438;
  local_3e0 = &local_238;
  local_3d8 = 3;
  lVar6 = 0x10;
  do {
    dVar8 = *(double *)
             ((long)local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array + lVar6);
    dVar9 = *(double *)
             ((long)local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array + lVar6 + 0x40);
    dVar10 = *(double *)((long)&dStack_240 + lVar6);
    pdVar1 = (double *)
             ((long)(__return_storage_ptr__->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar6 + -0x10);
    *pdVar1 = dVar10 * local_438[3] + dVar9 * local_438[0] + dVar8 * local_408;
    pdVar1[1] = dVar10 * dStack_418 + dVar9 * local_438[1] + dVar8 * dStack_400;
    *(double *)
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array + lVar6) =
         local_410 * dVar10 + dVar8 * local_3f8 + local_438[2] * dVar9;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x58);
  pMVar4 = __return_storage_ptr__;
  pMVar5 = &local_198;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
         = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
    pMVar4 = (Matrix3d *)((long)pMVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pMVar5 = (Matrix3d *)((long)pMVar5 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  OrthoNormMat(__return_storage_ptr__,&local_198);
  if (local_5a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_5a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d ECEF2ECI(double JD_UTC, Eigen::MatrixXd* nut80ptr, Eigen::MatrixXd* iau1980ptr, std::vector<Eigen::Matrix3d>* matvecptr){

		//********* deal with time ******************

		//J2000 time
		double J2000 = 2451545.0;

		//offset to get mean julian dates
		double MJD_offset = 2400000.5;

		//mean julian date, J2000
		double MJD_J2000 = J2000 - MJD_offset;

		//current mean JD
		double MJD_UTC = JD_UTC - MJD_offset;

		double MJD_TAI = MJD_UTC + 37.0/(3600.0*24.0);
		double MJD_TT = MJD_TAI + 32.184/(3600.0*24.0);

		// find the change in time since J2000.0 (T_TT)
		double tsinceJ2000 = (MJD_TT - MJD_J2000)/36525.0;

		//find the remainder in the current JD
		double JD_UTC_rem = MJD_UTC - floor(MJD_UTC);

		// std::cout << "MJD_J2000: " << MJD_J2000 << "\n";
		// std::cout << "MJD_UTC: " << MJD_UTC << "\n";
		// std::cout << "MJD_TAI: " << MJD_TAI << "\n";
		// std::cout << "MJD_TT: " << MJD_TT << "\n";
		// std::cout << "JD_UTC_rem: " << JD_UTC_rem << "\n";

		//we will manually find values from iau1980.txt because lazy
		// std::cout << "You need to manually find this in iau1980.txt \n";
		// std::cout << "floor(MJD_UTC): " << floor(MJD_UTC) << "\n";
		// exit(0);

		//manual search found this:
		// 1712 1 58088.00 I  0.124136 0.000022  0.236728 0.000035  I 0.2485001 0.0000084  1.5396 0.0061  I  -104.226    0.322    -8.561    0.160  0.124126  0.236687  0.2485227  -104.524    -8.685  
		// 1712 2 58089.00 I  0.121708 0.000026  0.236266 0.000028  I 0.2469699 0.0000084  1.4837 0.0058  I  -104.143    0.322    -8.430    0.160  0.121669  0.236396  0.2469833  -105.014    -8.516
		// double PMx1 = 0.124126;
		// double PMx2 = 0.121669;
		// double PMy1 = 0.236687;
		// double PMy2 = 0.236396;
		// double UT1_UTC1 = 0.24852270;
		// double UT1_UTC2 = 0.24698330;

		//get initial index of desired time
		int tidx = floor(MJD_UTC - iau1980ptr->coeff(0,0));

		// std::cout << "located at index: " << tidx << "\n";

		//extract values
		double PMx1 = iau1980ptr->coeff(tidx,1);
		double PMx2 = iau1980ptr->coeff(tidx+1,1);
		double PMy1 = iau1980ptr->coeff(tidx,2);
		double PMy2 = iau1980ptr->coeff(tidx+1,2);
		double UT1_UTC1 = iau1980ptr->coeff(tidx,3);
		double UT1_UTC2 = iau1980ptr->coeff(tidx+1,3);
		double LOD1 = iau1980ptr->coeff(tidx,4);
		double LOD2 = iau1980ptr->coeff(tidx+1,4);

		//******** find rotation from precession ******************

		//now, find the three angles in degrees
		double zeta_deg = 2306.2181*tsinceJ2000 + 0.30188*pow(tsinceJ2000,2) + 0.017998*pow(tsinceJ2000,3); 
		double theta_deg = 2004.3109*tsinceJ2000 - 0.42665*pow(tsinceJ2000,2) - 0.041833*pow(tsinceJ2000,3); 
		double z_deg = 2306.2181*tsinceJ2000 + 1.09468*pow(tsinceJ2000,2) + 0.018203*pow(tsinceJ2000,3);

		//convert angles to radians
		double zeta = zeta_deg*M_PI/(3600.0*180.0);
		double theta = theta_deg*M_PI/(3600.0*180.0);
		double z = z_deg*M_PI/(3600.0*180.0);

		// std::cout << "tsinceJ2000: " << tsinceJ2000 << "\n";
		// std::cout << "zeta: " << zeta << "\n";
		// std::cout << "theta: " << theta << "\n";
		// std::cout << "z: " << z << "\n";

		//create matrix
		Eigen::Vector3d angles(z,-theta,zeta);
		std::vector<int> order = {3,2,3};
		Eigen::Matrix3d P = Angle2RotM(angles, order);

		//******** find rotation from nutation ******************

		// load the parameters
		// Eigen::MatrixXd nut80 = LoadDatFile("../data/nut80.csv", 106, 10);

		//find epsbar1980
		double epsbar1980 = (84381.448 - 46.8150*tsinceJ2000 - 0.00059*pow(tsinceJ2000,2) + 0.001813*pow(tsinceJ2000,3))*M_PI/(3600.0*180.0);

		//find values from 3-82 (corrected according to errata)
		double r = 360.0;
		double M_moon = 134.96298139 + (1325.0*r + 198.8673981)*tsinceJ2000 + 0.0086972*pow(tsinceJ2000,2) + 1.78*pow(10.0,-5)*pow(tsinceJ2000,3);
		double M_cirle = 357.52772333 + (99.0*r + 359.0503400)*tsinceJ2000 - 0.0001603*pow(tsinceJ2000,2) - 3.3*pow(10.0,-6)*pow(tsinceJ2000,3);
		double uM_moon =  93.27191028 + (1342.0*r + 82.0175381)*tsinceJ2000 - 0.0036825*pow(tsinceJ2000,2) + 3.1*pow(10.0,-6)*pow(tsinceJ2000,3);
		double D_circle = 297.85036306 + (1236.0*r + 307.1114800)*tsinceJ2000 - 0.0019142*pow(tsinceJ2000,2) + 5.3*pow(10.0,-6)*pow(tsinceJ2000,3);
		double Ohm_moon = 125.04452222 - (5.0*r + 134.1362608)*tsinceJ2000 +  0.0020708*pow(tsinceJ2000,2) + 2.2*pow(10.0,-6)*pow(tsinceJ2000,3);

		//convert to radians
		M_moon = M_moon*M_PI/180.0;
		M_cirle = M_cirle*M_PI/180.0;
		uM_moon = uM_moon*M_PI/180.0;
		D_circle = D_circle*M_PI/180.0;
		Ohm_moon = Ohm_moon*M_PI/180.0;

		// std::cout << "M_moon: " << M_moon << "\n";
		// std::cout << "M_cirle: " << M_cirle << "\n";
		// std::cout << "uM_moon: " << uM_moon << "\n";
		// std::cout << "D_circle: " << D_circle << "\n";
		// std::cout << "Ohm_moon: " << Ohm_moon << "\n";

		// exit(0);

		//sum
		double deltaPsi_1980 = 0.0;
		double deltaEsp_1980 = 0.0;
		for (int ii = 0; ii < 106; ++ii) {

			//extract locals
			double an1 = nut80ptr->coeff(ii,0);
			double an2 = nut80ptr->coeff(ii,1);
			double an3 = nut80ptr->coeff(ii,2);
			double an4 = nut80ptr->coeff(ii,3);
			double an5 = nut80ptr->coeff(ii,4);
			double A = nut80ptr->coeff(ii,5);
			double B = nut80ptr->coeff(ii,6);
			double C = nut80ptr->coeff(ii,7);
			double D = nut80ptr->coeff(ii,8);
			double idx = nut80ptr->coeff(ii,9);

			//aPi
			double aPi = an1*M_moon + an2*M_cirle + an3*uM_moon + an4*D_circle + an5*Ohm_moon;

			//sums
			deltaPsi_1980 = deltaPsi_1980 + (A + B*tsinceJ2000)*sin(aPi);
			deltaEsp_1980 = deltaEsp_1980 + (C + D*tsinceJ2000)*cos(aPi);
		}

		//convert sums to radians
		deltaPsi_1980 = deltaPsi_1980*pow(10.0,-4)*M_PI/(3600.0*180.0);
		deltaEsp_1980 = deltaEsp_1980*pow(10.0,-4)*M_PI/(3600.0*180.0);

		// std::cout << "deltaPsi_1980: " << deltaPsi_1980 << "\n";
		// std::cout << "deltaEsp_1980: " << deltaEsp_1980 << "\n";

		//rotation
		order = {1,3,1};
		angles[0] = epsbar1980 + deltaEsp_1980;
		angles[1] = deltaPsi_1980;
		angles[2] = -epsbar1980;
		Eigen::Matrix3d N = Angle2RotM(angles,order);

		// std::cout << "angles: " << angles << "\n";

		//******** find rotation from Polar Motion ******************

		//interpolate these two values based on iau1980.txt
		double xp = PMx1 + JD_UTC_rem*(PMx2 - PMx1);
		double yp = PMy1 + JD_UTC_rem*(PMy2 - PMy1);

		//convert to radians
		xp = xp*M_PI/(3600.0*180.0);
		yp = yp*M_PI/(3600.0*180.0);

		//rotation
		order = {2,1,3};
		angles[0] = xp;
		angles[1] = yp;
		angles[2] = 0.0;
		Eigen::Matrix3d W = Angle2RotM(angles,order);

		//******** find rotation from Earth Rotation ******************

		//interpolate change in UTC
		double dUTC = UT1_UTC1 + JD_UTC_rem*(UT1_UTC2 - UT1_UTC1);

		//correct modified julian date
		double MJD_UT1 = MJD_UTC + dUTC/(24.0*3600.0);

		//change in time
		double dT = MJD_UT1 - MJD_J2000;

		//Greenwich mean sidereal time (from tapley shuctz born)
		double theta_GMST = 4.894961212823058751375704430 + dT*(6.300388098984893552276513720 + dT*(5.075209994113591478053805523*pow(10.0,-15) - 9.253097568194335640067190688*pow(10.0,-24)*dT));
		// double theta_GMST2 = 4.894961212823058751375704430 + (6.3003880989848935522776513720 + (5.07520999411359147805523e-15 - 9.253097568194335640067190688e-24*dT)*dT)*dT;

		// std::cout << "one: " << theta_GMST << "\n two: " << theta_GMST2;
		
		//now we get some other crazy value
		double Eqequinox1982 = deltaPsi_1980*cos(epsbar1980) + (0.00264*sin(Ohm_moon) + 0.000063*sin(2*Ohm_moon))*M_PI/(3600.0*180.0);

		//find theta
		double theta_GAST = theta_GMST + Eqequinox1982;

		//rotation
		order = {3,1,3};
		angles[0] = -theta_GAST;
		angles[1] = 0.0;
		angles[2] = 0.0;
		Eigen::Matrix3d S = Angle2RotM(angles,order);

		// std::cout << "JD_UTC_rem: " << JD_UTC_rem << "\n";
		// std::cout << "dUTC: " << dUTC << "\n";
		// std::cout << "UT1_UTC1: " << UT1_UTC1 << "\n";
		// std::cout << "UT1_UTC2: " << UT1_UTC2 << "\n";

		//enforce orthonormalization
		P = OrthoNormMat(P);
		N = OrthoNormMat(N);
		S = OrthoNormMat(S);
		W = OrthoNormMat(W);

		// //write out all the matricies
		// std::cout << "P:\n" << P << "\n";
		// std::cout << "N:\n" << N << "\n";
		// std::cout << "S:\n" << S << "\n";
		// std::cout << "W:\n" << W << "\n";

		//write each matrix to the vector
		(*matvecptr)[0] = P;
		(*matvecptr)[1] = N;
		(*matvecptr)[2] = S;
		(*matvecptr)[3] = W;

		//do something horrific and insert the LOD value into a new element of the matvecptr
		Eigen::Matrix3d horror = Eigen::Matrix3d::Zero(3,3);
		horror(0,0) = LOD1 + JD_UTC_rem*(LOD2 - LOD1);
		matvecptr->push_back(horror);

		//Matrix
		Eigen::Matrix3d Rotm = P*N*S*W;
		Rotm = OrthoNormMat(Rotm);

		//output
		return Rotm;

	}